

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O3

void jpeg_crop_scanline(j_decompress_ptr cinfo,JDIMENSION *xoffset,JDIMENSION *width)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_decomp_master *pjVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  JDIMENSION JVar11;
  JDIMENSION *pJVar12;
  long b;
  
  iVar1 = cinfo->global_state;
  if ((iVar1 != 0xcd) || (cinfo->output_scanline != 0)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x14;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (xoffset == (JDIMENSION *)0x0 || width == (JDIMENSION *)0x0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x7c;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  uVar10 = *width;
  if (uVar10 != 0) {
    uVar9 = cinfo->output_width;
    if (*xoffset + uVar10 <= uVar9) goto LAB_0011c80e;
  }
  pjVar2 = cinfo->err;
  pjVar2->msg_code = 0x46;
  (*pjVar2->error_exit)((j_common_ptr)cinfo);
  uVar10 = *width;
  uVar9 = cinfo->output_width;
LAB_0011c80e:
  if (uVar10 != uVar9) {
    if ((cinfo->comps_in_scan == 1) && (cinfo->num_components == 1)) {
      uVar10 = cinfo->min_DCT_scaled_size;
    }
    else {
      uVar10 = cinfo->max_h_samp_factor * cinfo->min_DCT_scaled_size;
    }
    uVar9 = *xoffset % uVar10;
    *xoffset = *xoffset - uVar9;
    JVar11 = uVar9 + *width;
    *width = JVar11;
    cinfo->output_width = JVar11;
    b = (long)(int)uVar10;
    cinfo->master->first_iMCU_col = SUB164(ZEXT416(*xoffset) / SEXT816(b),0);
    lVar6 = jdiv_round_up((ulong)(JVar11 + *xoffset),b);
    cinfo->master->last_iMCU_col = (int)lVar6 - 1;
    uVar8 = (ulong)(uint)cinfo->num_components;
    if (0 < cinfo->num_components) {
      pJVar12 = &cinfo->comp_info->downsampled_width;
      lVar6 = 0;
      bVar5 = false;
      do {
        uVar10 = pJVar12[-8];
        if ((int)uVar8 == 1 && cinfo->comps_in_scan == 1) {
          uVar10 = 1;
        }
        uVar9 = *pJVar12;
        lVar7 = jdiv_round_up((ulong)(pJVar12[-8] * cinfo->output_width),
                              (long)cinfo->max_h_samp_factor);
        bVar4 = bVar5;
        if (1 < (int)uVar9) {
          bVar4 = true;
        }
        *pJVar12 = (uint)lVar7;
        if (1 < (uint)lVar7) {
          bVar4 = bVar5;
        }
        cinfo->master->first_MCU_col[lVar6] = SUB164(ZEXT416(*xoffset * uVar10) / SEXT816(b),0);
        lVar7 = jdiv_round_up((ulong)((cinfo->output_width + *xoffset) * uVar10),b);
        pjVar3 = cinfo->master;
        pjVar3->last_MCU_col[lVar6] = (int)lVar7 - 1;
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)cinfo->num_components;
        pJVar12 = pJVar12 + 0x18;
        bVar5 = bVar4;
      } while (lVar6 < (long)uVar8);
      if (bVar4) {
        pjVar3->jinit_upsampler_no_alloc = 1;
        jinit_upsampler(cinfo);
        cinfo->master->jinit_upsampler_no_alloc = 0;
      }
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_crop_scanline(j_decompress_ptr cinfo, JDIMENSION *xoffset,
                   JDIMENSION *width)
{
  int ci, align, orig_downsampled_width;
  JDIMENSION input_xoffset;
  boolean reinit_upsampler = FALSE;
  jpeg_component_info *compptr;

  if (cinfo->global_state != DSTATE_SCANNING || cinfo->output_scanline != 0)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (!xoffset || !width)
    ERREXIT(cinfo, JERR_BAD_CROP_SPEC);

  /* xoffset and width must fall within the output image dimensions. */
  if (*width == 0 || *xoffset + *width > cinfo->output_width)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);

  /* No need to do anything if the caller wants the entire width. */
  if (*width == cinfo->output_width)
    return;

  /* Ensuring the proper alignment of xoffset is tricky.  At minimum, it
   * must align with an MCU boundary, because:
   *
   *   (1) The IDCT is performed in blocks, and it is not feasible to modify
   *       the algorithm so that it can transform partial blocks.
   *   (2) Because of the SIMD extensions, any input buffer passed to the
   *       upsampling and color conversion routines must be aligned to the
   *       SIMD word size (for instance, 128-bit in the case of SSE2.)  The
   *       easiest way to accomplish this without copying data is to ensure
   *       that upsampling and color conversion begin at the start of the
   *       first MCU column that will be inverse transformed.
   *
   * In practice, we actually impose a stricter alignment requirement.  We
   * require that xoffset be a multiple of the maximum MCU column width of all
   * of the components (the "iMCU column width.")  This is to simplify the
   * single-pass decompression case, allowing us to use the same MCU column
   * width for all of the components.
   */
  if (cinfo->comps_in_scan == 1 && cinfo->num_components == 1)
    align = cinfo->_min_DCT_scaled_size;
  else
    align = cinfo->_min_DCT_scaled_size * cinfo->max_h_samp_factor;

  /* Adjust xoffset to the nearest iMCU boundary <= the requested value */
  input_xoffset = *xoffset;
  *xoffset = (input_xoffset / align) * align;

  /* Adjust the width so that the right edge of the output image is as
   * requested (only the left edge is altered.)  It is important that calling
   * programs check this value after this function returns, so that they can
   * allocate an output buffer with the appropriate size.
   */
  *width = *width + input_xoffset - *xoffset;
  cinfo->output_width = *width;

  /* Set the first and last iMCU columns that we must decompress.  These values
   * will be used in single-scan decompressions.
   */
  cinfo->master->first_iMCU_col = (JDIMENSION)(long)(*xoffset) / (long)align;
  cinfo->master->last_iMCU_col =
    (JDIMENSION)jdiv_round_up((long)(*xoffset + cinfo->output_width),
                              (long)align) - 1;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int hsf = (cinfo->comps_in_scan == 1 && cinfo->num_components == 1) ?
              1 : compptr->h_samp_factor;

    /* Set downsampled_width to the new output width. */
    orig_downsampled_width = compptr->downsampled_width;
    compptr->downsampled_width =
      (JDIMENSION)jdiv_round_up((long)(cinfo->output_width *
                                       compptr->h_samp_factor),
                                (long)cinfo->max_h_samp_factor);
    if (compptr->downsampled_width < 2 && orig_downsampled_width >= 2)
      reinit_upsampler = TRUE;

    /* Set the first and last iMCU columns that we must decompress.  These
     * values will be used in multi-scan decompressions.
     */
    cinfo->master->first_MCU_col[ci] =
      (JDIMENSION)(long)(*xoffset * hsf) / (long)align;
    cinfo->master->last_MCU_col[ci] =
      (JDIMENSION)jdiv_round_up((long)((*xoffset + cinfo->output_width) * hsf),
                                (long)align) - 1;
  }

  if (reinit_upsampler) {
    cinfo->master->jinit_upsampler_no_alloc = TRUE;
    jinit_upsampler(cinfo);
    cinfo->master->jinit_upsampler_no_alloc = FALSE;
  }
}